

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O0

TypedDeleter<LLVMBC::AtomicCmpXchgInst> * __thiscall
LLVMBC::LLVMContext::
construct_trivial<LLVMBC::LLVMContext::TypedDeleter<LLVMBC::AtomicCmpXchgInst>,LLVMBC::AtomicCmpXchgInst*&>
          (LLVMContext *this,AtomicCmpXchgInst **u)

{
  TypedDeleter<LLVMBC::AtomicCmpXchgInst> *this_00;
  TypedDeleter<LLVMBC::AtomicCmpXchgInst> *t;
  TypedDeleter<LLVMBC::AtomicCmpXchgInst> *mem;
  AtomicCmpXchgInst **u_local;
  LLVMContext *this_local;
  
  this_00 = (TypedDeleter<LLVMBC::AtomicCmpXchgInst> *)allocate(this,0x10,8);
  if (this_00 == (TypedDeleter<LLVMBC::AtomicCmpXchgInst> *)0x0) {
    std::terminate();
  }
  TypedDeleter<LLVMBC::AtomicCmpXchgInst>::TypedDeleter(this_00,*u);
  return this_00;
}

Assistant:

T *construct_trivial(U &&... u)
	{
		T *mem = static_cast<T *>(allocate(sizeof(T), alignof(T)));
		if (!mem)
			std::terminate();
		T *t = new (mem) T(std::forward<U>(u)...);
		return t;
	}